

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O1

void __thiscall
cinatra::coro_http_response::to_buffers
          (coro_http_response *this,
          vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *buffers,string *size_str)

{
  pointer *ppcVar1;
  status_type sVar2;
  iterator __position;
  long lVar3;
  size_type sVar4;
  string_view content;
  const_buffer local_28;
  
  sVar2 = this->status_;
  local_28.size_ = 0x22;
  if (399 < (int)sVar2) {
    switch(sVar2) {
    case bad_request:
      local_28.data_ = "HTTP/1.1 400 Bad Request\r\n";
LAB_00159c6b:
      local_28.size_ = 0x1a;
      goto LAB_00159c79;
    case unauthorized:
      local_28.data_ = "HTTP/1.1 401 Unauthorized\r\n";
LAB_00159c4f:
      local_28.size_ = 0x1b;
      goto LAB_00159c79;
    case payment_required:
    case not_acceptable:
    case proxy_authentication_required:
    case request_timeout:
    case gone:
    case length_required:
    case precondition_failed:
    case request_entity_too_large:
    case request_uri_too_long:
    case unsupported_media_type:
      goto switchD_00159b0f_caseD_12f;
    case forbidden:
      local_28.data_ = "HTTP/1.1 403 Forbidden\r\n";
      break;
    case not_found:
      local_28.data_ = "HTTP/1.1 404 Not Found\r\n";
      break;
    case method_not_allowed:
      local_28.data_ = "HTTP/1.1 405 Method Not Allowed\r\n";
LAB_00159c5d:
      local_28.size_ = 0x21;
      goto LAB_00159c79;
    case conflict:
      local_28.data_ = "HTTP/1.1 409 Conflict\r\n";
LAB_00159c13:
      local_28.size_ = 0x17;
      goto LAB_00159c79;
    case range_not_satisfiable:
      local_28.data_ = "HTTP/1.1 416 Requested Range Not Satisfiable\r\n";
      local_28.size_ = 0x2e;
      goto LAB_00159c79;
    default:
      switch(sVar2) {
      case internal_server_error:
        local_28.data_ = "HTTP/1.1 500 Internal Server Error\r\n";
        local_28.size_ = 0x24;
        break;
      default:
        goto switchD_00159b0f_caseD_12f;
      case bad_gateway:
        local_28.data_ = "HTTP/1.1 502 Bad Gateway\r\n";
        goto LAB_00159c6b;
      case service_unavailable:
        local_28.data_ = "HTTP/1.1 503 Service Unavailable\r\n";
      }
      goto LAB_00159c79;
    }
    local_28.size_ = 0x18;
    goto LAB_00159c79;
  }
  switch(sVar2) {
  case ok:
    local_28.data_ = "HTTP/1.1 200 OK\r\n";
    local_28.size_ = 0x11;
    break;
  case created:
    local_28.data_ = "HTTP/1.1 201 Created\r\n";
    local_28.size_ = 0x16;
    break;
  case accepted:
    local_28.data_ = "HTTP/1.1 202 Accepted\r\n";
    goto LAB_00159c13;
  case nonauthoritative:
  case reset_content:
    goto switchD_00159b0f_caseD_12f;
  case no_content:
    local_28.data_ = "HTTP/1.1 204 No Content\r\n";
    local_28.size_ = 0x19;
    break;
  case partial_content:
    local_28.data_ = "HTTP/1.1 206 Partial Content\r\n";
    goto LAB_00159be2;
  default:
    switch(sVar2) {
    case multiple_choices:
      local_28.data_ = "HTTP/1.1 300 Multiple Choices\r\n";
      local_28.size_ = 0x1f;
      break;
    case moved_permanently:
      local_28.data_ = "HTTP/1.1 301 Moved Permanently\r\n";
      goto LAB_00159c41;
    case moved_temporarily:
      local_28.data_ = "HTTP/1.1 302 Moved Temporarily\r\n";
LAB_00159c41:
      local_28.size_ = 0x20;
      break;
    case not_modified:
      local_28.data_ = "HTTP/1.1 304 Not Modified\r\n";
      goto LAB_00159c4f;
    case temporary_redirect:
      local_28.data_ = "HTTP/1.1 307 Temporary Redirect\r\n";
      goto LAB_00159c5d;
    default:
      if (sVar2 == switching_protocols) {
        local_28.data_ = "HTTP/1.1 101 Switching Protocals\r\n";
        break;
      }
    case 0x12f:
    case use_proxy:
    case 0x132:
switchD_00159b0f_caseD_12f:
      local_28.data_ = "HTTP/1.1 501 Not Implemented\r\n";
LAB_00159be2:
      local_28.size_ = 0x1e;
    }
  }
LAB_00159c79:
  __position._M_current =
       (buffers->super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (buffers->super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
    _M_realloc_insert<asio::const_buffer>(buffers,__position,&local_28);
  }
  else {
    (__position._M_current)->data_ = local_28.data_;
    (__position._M_current)->size_ = local_28.size_;
    ppcVar1 = &(buffers->super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  build_resp_head(this,buffers);
  sVar4 = (this->content_)._M_string_length;
  lVar3 = 8;
  if (sVar4 == 0) {
    sVar4 = (this->content_view_)._M_len;
    lVar3 = 0xf8;
    if (sVar4 == 0) {
      return;
    }
  }
  content._M_str = *(char **)(this->buf_ + lVar3 + -0x2b);
  content._M_len = sVar4;
  handle_content(this,buffers,size_str,content);
  return;
}

Assistant:

void to_buffers(std::vector<asio::const_buffer> &buffers,
                  std::string &size_str) {
    buffers.push_back(asio::buffer(to_http_status_string(status_)));
    build_resp_head(buffers);
    if (!content_.empty()) {
      handle_content(buffers, size_str, content_);
    }
    else if (!content_view_.empty()) {
      handle_content(buffers, size_str, content_view_);
    }
  }